

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O0

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  reference ppEVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  byte in_DL;
  Diagnostic *in_RSI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDI;
  SourceLocation in_R8;
  undefined8 in_R9;
  ulong in_stack_00000008;
  ulong in_stack_00000010;
  size_t provided;
  Expression *arg;
  iterator __end2;
  iterator __begin2;
  Args *__range2;
  string *in_stack_ffffffffffffff58;
  Diagnostic *in_stack_ffffffffffffff60;
  Diagnostic *in_stack_ffffffffffffff70;
  SourceLocation this_00;
  ASTContext *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  SourceLocation in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode code;
  ulong local_60;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_48 [2];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_38;
  byte local_29;
  Diagnostic *local_28;
  SourceLocation local_18;
  undefined8 local_10;
  bool local_1;
  
  local_29 = in_DL & 1;
  local_38 = in_RCX;
  local_28 = in_RSI;
  local_18 = in_R8;
  local_10 = in_R9;
  local_48[0]._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff58);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff58);
    code = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_60 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                           ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                            0x13dc717);
      if ((local_29 & 1) != 0) {
        local_60 = local_60 - 1;
      }
      if (local_60 < in_stack_00000008) {
        sourceRange.startLoc._4_4_ = in_stack_ffffffffffffff84;
        sourceRange.startLoc._0_4_ = in_stack_ffffffffffffff80;
        sourceRange.endLoc = local_18;
        ASTContext::addDiag(in_stack_ffffffffffffff78,local_10._4_4_,sourceRange);
        Diagnostic::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        Diagnostic::operator<<<unsigned_long>(in_stack_ffffffffffffff70,(unsigned_long)in_RDI);
        Diagnostic::operator<<<unsigned_long>(in_stack_ffffffffffffff70,(unsigned_long)in_RDI);
        local_1 = false;
      }
      else if (in_stack_00000010 < local_60) {
        uVar3 = 0xa00007;
        ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (local_38,in_stack_00000010);
        this_00 = ((*ppEVar2)->sourceRange).startLoc;
        sourceRange_00.startLoc._4_4_ = uVar3;
        sourceRange_00.startLoc._0_4_ = in_stack_ffffffffffffff80;
        sourceRange_00.endLoc = in_stack_ffffffffffffff88;
        ASTContext::addDiag((ASTContext *)((*ppEVar2)->sourceRange).endLoc,code,sourceRange_00);
        Diagnostic::operator<<(local_28,in_stack_ffffffffffffff58);
        Diagnostic::operator<<<unsigned_long>((Diagnostic *)this_00,(unsigned_long)in_RDI);
        Diagnostic::operator<<<unsigned_long>((Diagnostic *)this_00,(unsigned_long)in_RDI);
        local_1 = false;
      }
      else {
        local_1 = true;
      }
      return local_1;
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(local_48);
    bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffff60);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(local_48);
  }
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        SLANG_ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}